

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
          (handle *__return_storage_ptr__,cow_guarded<int,_std::timed_mutex> *this)

{
  pointer piVar1;
  __shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  deleter local_70;
  unique_ptr<int,_std::default_delete<int>_> local_50;
  unique_ptr<int,_std::default_delete<int>_> val;
  undefined1 local_38 [8];
  shared_handle data;
  unique_lock<std::timed_mutex> guard;
  cow_guarded<int,_std::timed_mutex> *this_local;
  
  std::unique_lock<std::timed_mutex>::unique_lock
            ((unique_lock<std::timed_mutex> *)
             &data._M_t.
              super___uniq_ptr_impl<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_const_std::shared_ptr<const_int>_*,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
              .super__Head_base<0UL,_const_std::shared_ptr<const_int>_*,_false>,&this->m_writeMutex)
  ;
  lr_guarded<std::shared_ptr<const_int>,_std::mutex>::lock_shared
            ((lr_guarded<std::shared_ptr<const_int>,_std::mutex> *)local_38);
  piVar1 = (pointer)operator_new(4);
  this_00 = (__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
            ::operator*((unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
                         *)local_38);
  peVar2 = std::__shared_ptr_access<const_int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (this_00);
  *piVar1 = *peVar2;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,std::default_delete<int>> *)&local_50,piVar1);
  std::
  unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  ::reset((unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
           *)local_38,(pointer)0x0);
  piVar1 = std::unique_ptr<int,_std::default_delete<int>_>::release(&local_50);
  deleter::deleter(&local_70,
                   (unique_lock<std::timed_mutex> *)
                   &data._M_t.
                    super___uniq_ptr_impl<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_std::shared_ptr<const_int>_*,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
                    .super__Head_base<0UL,_const_std::shared_ptr<const_int>_*,_false>,this);
  cow_guarded<int,std::timed_mutex>::handle::
  unique_ptr<gmlc::libguarded::cow_guarded<int,std::timed_mutex>::deleter,void>
            ((handle *)__return_storage_ptr__,piVar1,&local_70);
  deleter::~deleter(&local_70);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_50);
  std::
  unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
  ::~unique_ptr((unique_ptr<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
                 *)local_38);
  std::unique_lock<std::timed_mutex>::~unique_lock
            ((unique_lock<std::timed_mutex> *)
             &data._M_t.
              super___uniq_ptr_impl<const_std::shared_ptr<const_int>,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_const_std::shared_ptr<const_int>_*,_gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::shared_deleter>
              .super__Head_base<0UL,_const_std::shared_ptr<const_int>_*,_false>);
  return __return_storage_ptr__;
}

Assistant:

auto cow_guarded<T, M>::lock() -> handle
{
    std::unique_lock<M> guard(m_writeMutex);

    auto data(m_data.lock_shared());
    std::unique_ptr<T> val(new T(**data));
    data.reset();

    return handle(val.release(), deleter(std::move(guard), *this));
}